

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_hal.cpp
# Opt level: O3

MPP_RET mpp_enc_hal_prepare(void *hal)

{
  code *UNRECOVERED_JUMPTABLE;
  MPP_RET MVar1;
  
  if (hal == (void *)0x0) {
    _mpp_log_l(2,"mpp_enc_hal","found NULL input ctx %p\n","mpp_enc_hal_prepare",0);
    return MPP_ERR_NULL_PTR;
  }
  if ((*(long *)((long)hal + 0x10) != 0) &&
     (UNRECOVERED_JUMPTABLE = *(code **)(*(long *)((long)hal + 0x10) + 0x28),
     UNRECOVERED_JUMPTABLE != (code *)0x0)) {
    MVar1 = (*UNRECOVERED_JUMPTABLE)(*(undefined8 *)((long)hal + 8));
    return MVar1;
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_enc_hal_prepare(void *hal)
{
    if (NULL == hal) {
        mpp_err_f("found NULL input ctx %p\n", hal);
        return MPP_ERR_NULL_PTR;
    }

    MppEncHalImpl *p = (MppEncHalImpl*)hal;
    if (!p->api || !p->api->prepare)
        return MPP_OK;

    return p->api->prepare(p->ctx);
}